

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall wasm::OptimizeInstructions::visitRefCast(OptimizeInstructions *this,RefCast *curr)

{
  bool bVar1;
  Module *pMVar2;
  Expression *pEVar3;
  Function *func;
  LocalSet *pLVar4;
  Drop *pDVar5;
  LocalGet *right;
  Block *pBVar6;
  PassOptions *pPVar7;
  RefAs *rep;
  HeapType heapType;
  bool local_181;
  Type local_160;
  RefAs *local_158;
  RefAs *as;
  Type local_148;
  uintptr_t local_140;
  uintptr_t local_138;
  EvaluationResult local_12c;
  RefCast *pRStack_128;
  EvaluationResult result_2;
  RefCast *child;
  uintptr_t local_118;
  EvaluationResult local_10c;
  Expression *pEStack_108;
  EvaluationResult result;
  Expression **last;
  Type local_f8;
  Type newType;
  HeapType local_e8;
  Drop *local_e0;
  RefNull *local_d8;
  initializer_list<wasm::Expression_*> local_d0;
  uintptr_t local_c0;
  Drop *local_b8;
  Unreachable *local_b0;
  initializer_list<wasm::Expression_*> local_a8;
  uintptr_t local_98;
  uintptr_t local_90;
  uintptr_t local_88;
  Index local_7c;
  HeapType HStack_78;
  Index scratch;
  uintptr_t local_70;
  uintptr_t local_68;
  uintptr_t local_60;
  uintptr_t local_58;
  EvaluationResult local_4c;
  Expression *pEStack_48;
  EvaluationResult result_1;
  Expression *ref;
  Expression **refp;
  BasicHeapType local_2c;
  BasicHeapType nullType;
  Builder builder;
  RefCast *curr_local;
  OptimizeInstructions *this_local;
  
  builder.wasm._4_4_ = 1;
  bVar1 = wasm::Type::operator==(&curr->ref->type,(BasicType *)((long)&builder.wasm + 4));
  if ((!bVar1) &&
     ((bVar1 = wasm::Type::isNonNullable
                         (&(curr->super_SpecificExpression<(wasm::Expression::Id)58>).
                           super_Expression.type), !bVar1 ||
      (bVar1 = trapOnNull(this,(Expression *)curr,&curr->ref), !bVar1)))) {
    pMVar2 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                        ).
                        super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        .
                        super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      );
    Builder::Builder((Builder *)&stack0xffffffffffffffd8,pMVar2);
    refp = (Expression **)
           wasm::Type::getHeapType
                     (&(curr->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.
                       type);
    local_2c = HeapType::getBottom((HeapType *)&refp);
    ref = (Expression *)&curr->ref;
    do {
      pEStack_48 = *(Expression **)ref;
      local_58 = (pEStack_48->type).id;
      local_60 = (curr->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.id
      ;
      local_4c = GCTypeUtils::evaluateCastCheck((Type)local_58,(Type)local_60);
      if (local_4c == Success) {
        local_68 = (pEStack_48->type).id;
        local_70 = (curr->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.
                   id;
        bVar1 = wasm::Type::isSubType((Type)local_68,(Type)local_70);
        if (!bVar1) {
          __assert_fail("Type::isSubType(ref->type, curr->type)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp"
                        ,0x7d5,"void wasm::OptimizeInstructions::visitRefCast(RefCast *)");
        }
        bVar1 = wasm::Type::operator!=
                          (&(curr->super_SpecificExpression<(wasm::Expression::Id)58>).
                            super_Expression.type,&pEStack_48->type);
        if (bVar1) {
          this->refinalize = true;
        }
        if (pEStack_48 == curr->ref) {
          replaceCurrent(this,pEStack_48);
          return;
        }
        bVar1 = wasm::Type::isNull(&pEStack_48->type);
        if (!bVar1) {
          func = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 ::getFunction(&(this->
                                super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                ).
                                super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                .
                                super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                              );
          local_88 = (pEStack_48->type).id;
          local_7c = Builder::addVar(func,(Type)local_88);
          local_90 = (pEStack_48->type).id;
          pLVar4 = Builder::makeLocalTee
                             ((Builder *)&stack0xffffffffffffffd8,local_7c,pEStack_48,(Type)local_90
                             );
          *(LocalSet **)ref = pLVar4;
          pDVar5 = Builder::makeDrop((Builder *)&stack0xffffffffffffffd8,curr->ref);
          local_98 = (pEStack_48->type).id;
          right = Builder::makeLocalGet((Builder *)&stack0xffffffffffffffd8,local_7c,(Type)local_98)
          ;
          pBVar6 = Builder::makeSequence
                             ((Builder *)&stack0xffffffffffffffd8,(Expression *)pDVar5,
                              (Expression *)right);
          replaceCurrent(this,(Expression *)pBVar6);
          return;
        }
        pDVar5 = Builder::makeDrop((Builder *)&stack0xffffffffffffffd8,curr->ref);
        HeapType::HeapType(&stack0xffffffffffffff88,local_2c);
        pEVar3 = (Expression *)Builder::makeRefNull((Builder *)&stack0xffffffffffffffd8,HStack_78);
        pBVar6 = Builder::makeSequence
                           ((Builder *)&stack0xffffffffffffffd8,(Expression *)pDVar5,pEVar3);
        replaceCurrent(this,(Expression *)pBVar6);
        return;
      }
      if (local_4c == Failure) {
        local_b8 = Builder::makeDrop((Builder *)&stack0xffffffffffffffd8,curr->ref);
        local_b0 = Builder::makeUnreachable((Builder *)&stack0xffffffffffffffd8);
        local_a8._M_array = (iterator)&local_b8;
        local_a8._M_len = 2;
        local_c0 = (curr->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.
                   id;
        pBVar6 = Builder::makeBlock((Builder *)&stack0xffffffffffffffd8,&local_a8,(Type)local_c0);
        replaceCurrent(this,(Expression *)pBVar6);
        return;
      }
      if (local_4c == SuccessOnlyIfNull) {
        bVar1 = wasm::Type::isNullable
                          (&(curr->super_SpecificExpression<(wasm::Expression::Id)58>).
                            super_Expression.type);
        local_181 = false;
        if (bVar1) {
          local_181 = wasm::Type::isNullable(&curr->ref->type);
        }
        if (local_181 == false) {
          __assert_fail("curr->type.isNullable() && curr->ref->type.isNullable()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp"
                        ,0x7fc,"void wasm::OptimizeInstructions::visitRefCast(RefCast *)");
        }
        pPVar7 = Pass::getPassOptions((Pass *)this);
        if ((pPVar7->trapsNeverHappen & 1U) != 0) {
          local_e0 = Builder::makeDrop((Builder *)&stack0xffffffffffffffd8,curr->ref);
          HeapType::HeapType(&local_e8,local_2c);
          local_d8 = Builder::makeRefNull((Builder *)&stack0xffffffffffffffd8,local_e8);
          local_d0._M_array = (iterator)&local_e0;
          local_d0._M_len = 2;
          newType.id = (curr->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.
                       type.id;
          pBVar6 = Builder::makeBlock((Builder *)&stack0xffffffffffffffd8,&local_d0,newType);
          replaceCurrent(this,(Expression *)pBVar6);
          return;
        }
        HeapType::HeapType((HeapType *)&last,local_2c);
        wasm::Type::Type(&local_f8,(HeapType)last,Nullable);
        bVar1 = wasm::Type::operator!=
                          (&(curr->super_SpecificExpression<(wasm::Expression::Id)58>).
                            super_Expression.type,&local_f8);
        if (bVar1) {
          (curr->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.id =
               local_f8.id;
          replaceCurrent(this,(Expression *)curr);
          return;
        }
      }
      pEVar3 = ref;
      pEStack_108 = ref;
      pPVar7 = Pass::getPassOptions((Pass *)this);
      pMVar2 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               ::getModule(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                            ).
                            super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                            .
                            super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                          );
      ref = (Expression *)
            Properties::getImmediateFallthroughPtr((Expression **)pEVar3,pPVar7,pMVar2,AllowTeeBrIf)
      ;
    } while (ref != pEStack_108);
    local_118 = (curr->ref->type).id;
    child = (RefCast *)
            (curr->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.id;
    local_10c = GCTypeUtils::evaluateCastCheck((Type)local_118,(Type)child);
    if (local_10c == Success) {
      replaceCurrent(this,curr->ref);
    }
    else if (local_10c == SuccessOnlyIfNonNull) {
      rep = Builder::makeRefAs((Builder *)&stack0xffffffffffffffd8,RefAsNonNull,curr->ref);
      replaceCurrent(this,(Expression *)rep);
    }
    else {
      pRStack_128 = Expression::dynCast<wasm::RefCast>(curr->ref);
      if (pRStack_128 != (RefCast *)0x0) {
        local_138 = (curr->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type
                    .id;
        local_140 = (pRStack_128->super_SpecificExpression<(wasm::Expression::Id)58>).
                    super_Expression.type.id;
        local_12c = GCTypeUtils::evaluateCastCheck((Type)local_138,(Type)local_140);
        if (local_12c == Success) {
          curr->ref = pRStack_128->ref;
          return;
        }
        if (local_12c == SuccessOnlyIfNonNull) {
          curr->ref = pRStack_128->ref;
          as = (RefAs *)wasm::Type::getHeapType
                                  (&(curr->super_SpecificExpression<(wasm::Expression::Id)58>).
                                    super_Expression.type);
          wasm::Type::Type(&local_148,(HeapType)as,NonNullable);
          (curr->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.id =
               local_148.id;
          return;
        }
      }
      local_158 = Expression::dynCast<wasm::RefAs>(curr->ref);
      if ((local_158 != (RefAs *)0x0) && (local_158->op == RefAsNonNull)) {
        curr->ref = local_158->value;
        heapType = wasm::Type::getHeapType
                             (&(curr->super_SpecificExpression<(wasm::Expression::Id)58>).
                               super_Expression.type);
        wasm::Type::Type(&local_160,heapType,NonNullable);
        (curr->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.id =
             local_160.id;
      }
    }
  }
  return;
}

Assistant:

void visitRefCast(RefCast* curr) {
    // Note we must check the ref's type here and not our own, since we only
    // refinalize at the end, which means our type may not have been updated yet
    // after a change in the child.
    // TODO: we could update unreachability up the stack perhaps, or just move
    //       all patterns that can add unreachability to a pass that does so
    //       already like vacuum or dce.
    if (curr->ref->type == Type::unreachable) {
      return;
    }

    if (curr->type.isNonNullable() && trapOnNull(curr, curr->ref)) {
      return;
    }

    // Check whether the cast will definitely fail (or succeed). Look not just
    // at the fallthrough but all intermediatary fallthrough values as well, as
    // if any of them has a type that cannot be cast to us, then we will trap,
    // e.g.
    //
    //   (ref.cast $struct-A
    //     (ref.cast $struct-B
    //       (ref.cast $array
    //         (local.get $x)
    //
    // The fallthrough is the local.get, but the array cast in the middle
    // proves a trap must happen.
    Builder builder(*getModule());
    auto nullType = curr->type.getHeapType().getBottom();
    {
      auto** refp = &curr->ref;
      while (1) {
        auto* ref = *refp;

        auto result = GCTypeUtils::evaluateCastCheck(ref->type, curr->type);

        if (result == GCTypeUtils::Success) {
          // The cast will succeed. This can only happen if the ref is a subtype
          // of the cast instruction, which means we can replace the cast with
          // the ref.
          assert(Type::isSubType(ref->type, curr->type));
          if (curr->type != ref->type) {
            refinalize = true;
          }
          // If there were no intermediate expressions, we can just skip the
          // cast.
          if (ref == curr->ref) {
            replaceCurrent(ref);
            return;
          }
          // Otherwise we can't just remove the cast and replace it with `ref`
          // because the intermediate expressions might have had side effects.
          // We can replace the cast with a drop followed by a direct return of
          // the value, though.
          if (ref->type.isNull()) {
            // We can materialize the resulting null value directly.
            replaceCurrent(builder.makeSequence(builder.makeDrop(curr->ref),
                                                builder.makeRefNull(nullType)));
            return;
          }
          // We need to use a tee to return the value since we can't materialize
          // it directly.
          auto scratch = builder.addVar(getFunction(), ref->type);
          *refp = builder.makeLocalTee(scratch, ref, ref->type);
          replaceCurrent(
            builder.makeSequence(builder.makeDrop(curr->ref),
                                 builder.makeLocalGet(scratch, ref->type)));
          return;
        } else if (result == GCTypeUtils::Failure) {
          // This cast cannot succeed, so it will trap.
          // Make sure to emit a block with the same type as us; leave updating
          // types for other passes.
          replaceCurrent(builder.makeBlock(
            {builder.makeDrop(curr->ref), builder.makeUnreachable()},
            curr->type));
          return;
        } else if (result == GCTypeUtils::SuccessOnlyIfNull) {
          // If either cast or ref types were non-nullable then the cast could
          // never succeed, and we'd have reached |Failure|, above.
          assert(curr->type.isNullable() && curr->ref->type.isNullable());

          // The cast either returns null, or traps. In trapsNeverHappen mode
          // we know the result, since it by assumption will not trap.
          if (getPassOptions().trapsNeverHappen) {
            replaceCurrent(builder.makeBlock(
              {builder.makeDrop(curr->ref), builder.makeRefNull(nullType)},
              curr->type));
            return;
          }

          // Without trapsNeverHappen we can at least sharpen the type here, if
          // it is not already a null type.
          auto newType = Type(nullType, Nullable);
          if (curr->type != newType) {
            curr->type = newType;
            // Call replaceCurrent() to make us re-optimize this node, as we
            // may have just unlocked further opportunities. (We could just
            // continue down to the rest, but we'd need to do more work to
            // make sure all the local state in this function is in sync
            // which this change; it's easier to just do another clean pass
            // on this node.)
            replaceCurrent(curr);
            return;
          }
        }

        auto** last = refp;
        refp = Properties::getImmediateFallthroughPtr(
          refp, getPassOptions(), *getModule());
        if (refp == last) {
          break;
        }
      }
    }

    // See what we know about the cast result.
    //
    // Note that we could look at the fallthrough for the ref, but that would
    // require additional work to make sure we emit something that validates
    // properly. TODO
    auto result = GCTypeUtils::evaluateCastCheck(curr->ref->type, curr->type);

    if (result == GCTypeUtils::Success) {
      replaceCurrent(curr->ref);
      return;
    } else if (result == GCTypeUtils::SuccessOnlyIfNonNull) {
      // All we need to do is check for a null here.
      //
      // As above, we must refinalize as we may now be emitting a more refined
      // type (specifically a more refined heap type).
      replaceCurrent(builder.makeRefAs(RefAsNonNull, curr->ref));
      return;
    }

    if (auto* child = curr->ref->dynCast<RefCast>()) {
      // Repeated casts can be removed, leaving just the most demanding of
      // them. Note that earlier we already checked for the cast of the ref's
      // type being more refined, so all we need to handle is the opposite, that
      // is, something like this:
      //
      //   (ref.cast $B
      //     (ref.cast $A
      //
      // where $B is a subtype of $A. We don't need to cast to $A here; we can
      // just cast all the way to $B immediately. To check this, see if the
      // parent's type would succeed if cast by the child's; if it must then the
      // child's is redundant.
      auto result = GCTypeUtils::evaluateCastCheck(curr->type, child->type);
      if (result == GCTypeUtils::Success) {
        curr->ref = child->ref;
        return;
      } else if (result == GCTypeUtils::SuccessOnlyIfNonNull) {
        // Similar to above, but we must also trap on null.
        curr->ref = child->ref;
        curr->type = Type(curr->type.getHeapType(), NonNullable);
        return;
      }
    }

    // ref.cast can be combined with ref.as_non_null,
    //
    //   (ref.cast null (ref.as_non_null ..))
    // =>
    //   (ref.cast ..)
    //
    if (auto* as = curr->ref->dynCast<RefAs>()) {
      if (as->op == RefAsNonNull) {
        curr->ref = as->value;
        curr->type = Type(curr->type.getHeapType(), NonNullable);
      }
    }
  }